

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geom3d.c
# Opt level: O0

matrix4 * v3translationMat(vector3d *axis,matrix4 *m)

{
  matrix4 *m_local;
  vector3d *axis_local;
  
  v3identityMat(m);
  m->element[3][0] = axis->x;
  m->element[3][1] = axis->y;
  m->element[3][2] = axis->z;
  return m;
}

Assistant:

matrix4*  v3translationMat(vector3d* axis, matrix4* m) {

	v3identityMat(m);

	m->element[3][0] = axis->x;
	m->element[3][1] = axis->y;
	m->element[3][2] = axis->z;

	return(m);
}